

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility>
slang::ast::getMethodFlags(TokenList *qualifiers,FunctionPrototypeSyntax *proto)

{
  ushort uVar1;
  short sVar2;
  ulong uVar3;
  long in_RCX;
  long in_RDX;
  iterator __begin2;
  uint uVar4;
  long lVar5;
  
  uVar3 = 0;
  if (proto == (FunctionPrototypeSyntax *)0x0) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar1 = *(ushort *)((long)&(qualifiers->super_SyntaxListBase)._vptr_SyntaxListBase + lVar5);
      if (uVar1 < 0xf8) {
        if (0xd0 < uVar1) {
          if (uVar1 == 0xd1) {
            uVar3 = 2;
          }
          else {
            uVar3 = 1;
          }
        }
      }
      else if (uVar1 < 0x11c) {
        if (uVar1 == 0xf8) {
          uVar4 = uVar4 | 2;
        }
      }
      else if (uVar1 == 0x11c) {
        uVar4 = uVar4 | 4;
      }
      else {
        uVar4 = uVar4 | 1;
      }
      lVar5 = lVar5 + 0x10;
    } while ((long)proto * 0x10 != lVar5);
    uVar3 = uVar3 << 0x20;
  }
  if (in_RCX != 0) {
    lVar5 = 0;
    do {
      if ((*(byte *)(*(long *)(in_RDX + lVar5) + 0x2a) & 1) == 0) {
        sVar2 = *(short *)(*(long *)(in_RDX + lVar5) + 0x28);
        if (sVar2 == 0xa6) {
          uVar4 = uVar4 | 0x4000;
        }
        else if (sVar2 == 0xa8) {
          uVar4 = uVar4 | 0x8000;
        }
        else {
          uVar4 = uVar4 | 0x2000;
        }
      }
      lVar5 = lVar5 + 8;
    } while (in_RCX * 8 != lVar5);
  }
  return (pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility>)(uVar3 | uVar4);
}

Assistant:

static std::pair<bitmask<MethodFlags>, Visibility> getMethodFlags(
    const TokenList& qualifiers, const FunctionPrototypeSyntax& proto) {

    bitmask<MethodFlags> flags;
    auto visibility = Visibility::Public;
    for (Token qual : qualifiers) {
        switch (qual.kind) {
            case TokenKind::LocalKeyword:
                visibility = Visibility::Local;
                break;
            case TokenKind::ProtectedKeyword:
                visibility = Visibility::Protected;
                break;
            case TokenKind::StaticKeyword:
                flags |= MethodFlags::Static;
                break;
            case TokenKind::PureKeyword:
                flags |= MethodFlags::Pure;
                break;
            case TokenKind::VirtualKeyword:
                flags |= MethodFlags::Virtual;
                break;
            case TokenKind::ConstKeyword:
            case TokenKind::ExternKeyword:
            case TokenKind::RandKeyword:
                // Parser already issued errors for these, so just ignore them here.
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    for (auto specifier : proto.specifiers) {
        if (!specifier->keyword.isMissing()) {
            switch (specifier->keyword.kind) {
                case TokenKind::InitialKeyword:
                    flags |= MethodFlags::Initial;
                    break;
                case TokenKind::ExtendsKeyword:
                    flags |= MethodFlags::Extends;
                    break;
                case TokenKind::FinalKeyword:
                    flags |= MethodFlags::Final;
                    break;
                default:
                    SLANG_UNREACHABLE;
            }
        }
    }

    return {flags, visibility};
}